

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O1

void Rwt_ManPrintStats(Rwt_Man_t *p)

{
  long lVar1;
  uint uVar2;
  int level;
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar2 = uVar2 + (0 < p->nScores[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xde);
  puts("Rewriting statistics:");
  printf("Total cuts tries  = %8d.\n",(ulong)(uint)p->nCutsGood);
  printf("Bad cuts found    = %8d.\n",(ulong)(uint)p->nCutsBad);
  printf("Total subgraphs   = %8d.\n",(ulong)(uint)p->nSubgraphs);
  printf("Used NPN classes  = %8d.\n",(ulong)uVar2);
  printf("Nodes considered  = %8d.\n",(ulong)(uint)p->nNodesConsidered);
  printf("Nodes rewritten   = %8d.\n",(ulong)(uint)p->nNodesRewritten);
  level = 0x8d866d;
  printf("Calculated gain   = %8d.\n",(ulong)(uint)p->nNodesGained);
  Abc_Print(level,"%s =","Start       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeStart / 1000000.0);
  Abc_Print(level,"%s =","Cuts        ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeCut / 1000000.0);
  Abc_Print(level,"%s =","Truth       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTruth / 1000000.0);
  Abc_Print(level,"%s =","Resynthesis ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeRes / 1000000.0);
  Abc_Print(level,"%s =","    Mffc    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeMffc / 1000000.0);
  Abc_Print(level,"%s =","    Eval    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeEval / 1000000.0);
  Abc_Print(level,"%s =","Update      ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeUpdate / 1000000.0);
  Abc_Print(level,"%s =","TOTAL       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Rwt_ManPrintStats( Rwt_Man_t * p )
{
    int i, Counter = 0;
    for ( i = 0; i < 222; i++ )
        Counter += (p->nScores[i] > 0);

    printf( "Rewriting statistics:\n" );
    printf( "Total cuts tries  = %8d.\n", p->nCutsGood );
    printf( "Bad cuts found    = %8d.\n", p->nCutsBad );
    printf( "Total subgraphs   = %8d.\n", p->nSubgraphs );
    printf( "Used NPN classes  = %8d.\n", Counter );
    printf( "Nodes considered  = %8d.\n", p->nNodesConsidered );
    printf( "Nodes rewritten   = %8d.\n", p->nNodesRewritten );
    printf( "Calculated gain   = %8d.\n", p->nNodesGained     );
    ABC_PRT( "Start       ", p->timeStart );
    ABC_PRT( "Cuts        ", p->timeCut );
    ABC_PRT( "Truth       ", p->timeTruth );
    ABC_PRT( "Resynthesis ", p->timeRes );
    ABC_PRT( "    Mffc    ", p->timeMffc );
    ABC_PRT( "    Eval    ", p->timeEval );
    ABC_PRT( "Update      ", p->timeUpdate );
    ABC_PRT( "TOTAL       ", p->timeTotal );

/*
    printf( "The scores are:\n" );
    for ( i = 0; i < 222; i++ )
        if ( p->nScores[i] > 0 )
        {
            extern void Ivy_TruthDsdComputePrint( unsigned uTruth );
            printf( "%3d = %8d  canon = %5d  ", i, p->nScores[i], p->pMapInv[i] );
            Ivy_TruthDsdComputePrint( (unsigned)p->pMapInv[i] | ((unsigned)p->pMapInv[i] << 16) );
        }
    printf( "\n" );
*/
}